

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O3

string * svg::attribute<char[27]>
                   (string *__return_storage_ptr__,string *attribute_name,char (*value) [27],
                   string *unit)

{
  ostream *poVar1;
  size_t sVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(attribute_name->_M_dataplus)._M_p,attribute_name->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
  sVar2 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*value,sVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(unit->_M_dataplus)._M_p,unit->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline std::string attribute(std::string const & attribute_name,
        T const & value, std::string const & unit = "")
    {
        std::stringstream ss;
        ss << attribute_name << "=\"" << value << unit << "\" ";
        return ss.str();
    }